

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O2

ym2612_ * YM2612_Init(UINT32 Clock,UINT32 Rate,UINT8 Interpolation)

{
  undefined1 auVar1 [16];
  int iVar2;
  ym2612_ *YM2612;
  uint *puVar3;
  int (*paiVar4) [32];
  uint uVar5;
  UINT8 (*paUVar6) [32];
  ulong uVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar21;
  
  if (Clock != 0 && Rate != 0) {
    lVar9 = 1;
    YM2612 = (ym2612_ *)calloc(1,0x4958);
    if (YM2612 != (ym2612_ *)0x0) {
      YM2612->Clock = Clock;
      YM2612->Rate = Rate;
      dVar15 = ((double)(int)Clock / (double)(int)Rate) / 144.0;
      YM2612->Frequence = dVar15;
      YM2612->TimerBase = (int)(dVar15 * 4096.0);
      uVar5 = 0x4000;
      if ((Interpolation != '\0') && (1.0 < dVar15)) {
        uVar5 = (uint)(long)((1.0 / dVar15) * 16384.0);
        YM2612->Rate = (int)Clock / 0x90;
        YM2612->Frequence = 1.0;
        dVar15 = 1.0;
      }
      YM2612->Inter_Step = uVar5;
      piVar8 = TL_TAB;
      for (uVar7 = 0; uVar7 != 0x3000; uVar7 = uVar7 + 1) {
        if (uVar7 < 0xd00) {
          dVar11 = pow(10.0,((double)(int)uVar7 * 0.0234375) / 20.0);
          *piVar8 = (int)(268435455.0 / dVar11);
          iVar2 = -(int)(268435455.0 / dVar11);
        }
        else {
          *piVar8 = 0;
          iVar2 = 0;
        }
        TL_TAB[uVar7 + 0x3000] = iVar2;
        piVar8 = piVar8 + 1;
      }
      SIN_TAB[0x800] = TL_TAB + 0xd00;
      SIN_TAB[0] = TL_TAB + 0xd00;
      for (lVar10 = 0x7ff; lVar10 != 0x3ff; lVar10 = lVar10 + -1) {
        dVar11 = sin((double)(int)lVar9 * 6.283185307179586 * 0.000244140625);
        dVar11 = log10(1.0 / dVar11);
        iVar2 = (int)((dVar11 * 20.0) / 0.0234375);
        if (0xcff < iVar2) {
          iVar2 = 0xd00;
        }
        SIN_TAB[lVar10] = TL_TAB + iVar2;
        SIN_TAB[lVar9] = TL_TAB + iVar2;
        piVar8 = (int *)((long)iVar2 * 4 + 0x1e48d0);
        SIN_TAB[lVar10 + 0x800] = piVar8;
        SIN_TAB[lVar9 + 0x800] = piVar8;
        lVar9 = lVar9 + 1;
      }
      lVar10 = 0;
      for (lVar9 = 0; lVar9 != 0x400; lVar9 = lVar9 + 1) {
        dVar11 = (double)(int)lVar9 * 6.283185307179586 * 0.0009765625;
        dVar12 = sin(dVar11);
        *(int *)((long)LFO_ENV_TAB + lVar10) = (int)((dVar12 + 1.0) * 0.5 * 503.4666666666667);
        dVar11 = sin(dVar11);
        *(int *)((long)LFO_FREQ_TAB + lVar10) = (int)(dVar11 * 511.0);
        lVar10 = lVar10 + 4;
      }
      iVar2 = 0xfff;
      for (lVar9 = 0; lVar9 != 0x1000; lVar9 = lVar9 + 1) {
        dVar11 = pow((double)iVar2 * 0.000244140625,8.0);
        ENV_TAB[lVar9] = (int)(dVar11 * 4096.0);
        ENV_TAB[lVar9 + 0x1000] = (int)((double)(int)lVar9 * 0.000244140625 * 4096.0);
        iVar2 = iVar2 + -1;
      }
      ENV_TAB[0x2000] = 0xfff;
      iVar2 = 0xfff;
      uVar7 = 0;
      do {
        if (uVar7 == 0x1000) {
          puVar3 = SL_TAB;
          for (lVar9 = 0; lVar9 != 0x2d; lVar9 = lVar9 + 3) {
            *puVar3 = (int)((double)(int)lVar9 / 0.0234375) * 0x10000 + 0x10000000;
            puVar3 = puVar3 + 1;
          }
          SL_TAB[0xf] = 0x1fff0000;
          for (lVar9 = 0; lVar9 != 0x800; lVar9 = lVar9 + 1) {
            YM2612->FINC_TAB[lVar9] = (uint)(long)((double)(int)lVar9 * dVar15 * 4096.0 * 0.5);
          }
          for (lVar9 = 0xce4; lVar9 != 0xce8; lVar9 = lVar9 + 1) {
            *(undefined4 *)((long)YM2612 + lVar9 * 4 + -0x200) = 0;
            YM2612->CHANNEL[0].S0_OUT[lVar9 + -0x18] = 0;
          }
          for (uVar7 = 0; uVar7 != 0x3c; uVar7 = uVar7 + 1) {
            dVar11 = (double)(1 << ((byte)(uVar7 >> 2) & 0x1f)) *
                     ((double)((uint)uVar7 & 3) * 0.25 + 1.0) * dVar15 * 268435456.0;
            YM2612->AR_TAB[uVar7 + 4] = (uint)(long)(dVar11 / 399128.0);
            YM2612->DR_TAB[uVar7 + 4] = (uint)(long)(dVar11 / 5514396.0);
          }
          for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 4) {
            *(uint *)((long)YM2612->AR_TAB + lVar9 + 0x100) = YM2612->AR_TAB[0x3f];
            *(uint *)((long)(YM2612->DT_TAB + -1) + lVar9) = YM2612->DR_TAB[0x3f];
            *(undefined4 *)((long)NULL_RATE + lVar9) = 0;
          }
          paiVar4 = YM2612->DT_TAB + 4;
          paUVar6 = DT_DEF_TAB;
          for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
            for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
              dVar11 = (double)(*paUVar6)[lVar10] * dVar15 * 32.0;
              paiVar4[-4][lVar10] = (int)dVar11;
              (*paiVar4)[lVar10] = (int)-dVar11;
            }
            paUVar6 = paUVar6 + 1;
            paiVar4 = paiVar4 + 1;
          }
          dVar15 = (double)(YM2612->Inter_Step * YM2612->Rate >> 0xe);
          uVar13 = SUB84(dVar15,0);
          uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
          auVar16._8_4_ = uVar13;
          auVar16._0_8_ = dVar15;
          auVar16._12_4_ = uVar14;
          auVar17 = divpd(_DAT_00162550,auVar16);
          iVar2 = (int)auVar17._0_8_;
          iVar20 = (int)auVar17._8_8_;
          auVar18._8_4_ = uVar13;
          auVar18._0_8_ = dVar15;
          auVar18._12_4_ = uVar14;
          auVar16 = divpd(_DAT_00162540,auVar18);
          iVar19 = (int)auVar16._0_8_;
          iVar21 = (int)auVar16._8_8_;
          *(ulong *)YM2612->LFO_INC_TAB =
               CONCAT44((int)(auVar16._8_8_ - 2147483648.0),(int)(auVar16._0_8_ - 2147483648.0)) &
               CONCAT44(iVar21 >> 0x1f,iVar19 >> 0x1f) | CONCAT44(iVar21,iVar19);
          *(ulong *)(YM2612->LFO_INC_TAB + 2) =
               CONCAT44((int)(auVar17._8_8_ - 2147483648.0),(int)(auVar17._0_8_ - 2147483648.0)) &
               CONCAT44(iVar20 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar20,iVar2);
          auVar17._8_4_ = uVar13;
          auVar17._0_8_ = dVar15;
          auVar17._12_4_ = uVar14;
          auVar16 = divpd(_DAT_00162570,auVar17);
          auVar1._8_4_ = uVar13;
          auVar1._0_8_ = dVar15;
          auVar1._12_4_ = uVar14;
          auVar18 = divpd(_DAT_00162580,auVar1);
          iVar2 = (int)auVar18._0_8_;
          iVar20 = (int)auVar18._8_8_;
          iVar19 = (int)auVar16._0_8_;
          iVar21 = (int)auVar16._8_8_;
          *(ulong *)(YM2612->LFO_INC_TAB + 4) =
               CONCAT44((int)(auVar16._8_8_ - 2147483648.0),(int)(auVar16._0_8_ - 2147483648.0)) &
               CONCAT44(iVar21 >> 0x1f,iVar19 >> 0x1f) | CONCAT44(iVar21,iVar19);
          *(ulong *)(YM2612->LFO_INC_TAB + 6) =
               CONCAT44((int)(auVar18._8_8_ - 2147483648.0),(int)(auVar18._0_8_ - 2147483648.0)) &
               CONCAT44(iVar20 >> 0x1f,iVar2 >> 0x1f) | CONCAT44(iVar20,iVar2);
          YM2612_SetMute(YM2612,0);
          return YM2612;
        }
        for (lVar9 = 0; -lVar9 != (long)iVar2; lVar9 = lVar9 + -1) {
          if (uVar7 <= ENV_TAB[lVar9 + iVar2]) {
            iVar2 = iVar2 + (int)lVar9;
            goto LAB_00128c64;
          }
        }
        iVar2 = 0;
LAB_00128c64:
        DECAY_TO_ATTACK[uVar7] = iVar2 << 0x10;
        uVar7 = uVar7 + 1;
      } while( true );
    }
  }
  return (ym2612_ *)0x0;
}

Assistant:

ym2612_ *YM2612_Init(UINT32 Clock, UINT32 Rate, UINT8 Interpolation)
{
  ym2612_ *YM2612;
  int i, j;
  double x;

  if ((Rate == 0) || (Clock == 0))
    return NULL;

  YM2612 = (ym2612_ *)calloc(1, sizeof(ym2612_));
  if (YM2612 == NULL)
    return YM2612;

#if YM_DEBUG_LEVEL > 0
  if (debug_file == NULL)
  {
    debug_file = fopen("ym2612.log", "w");
    fprintf(debug_file, "YM2612 logging :\n\n");
  }
#endif

  YM2612->Clock = Clock;
  YM2612->Rate = Rate;

  YM2612->DAC_Highpass_Enable = 0;
  YM2612->Enable_SSGEG = 0;

  // 144 = 12 * (prescale * 2) = 12 * 6 * 2
  // prescale set to 6 by default

  YM2612->Frequence = ((double)(YM2612->Clock) / (double)(YM2612->Rate)) / 144.0;
  YM2612->TimerBase = (int) (YM2612->Frequence * 4096.0);

  if ((Interpolation) && (YM2612->Frequence > 1.0))
  {
    YM2612->Inter_Step = (unsigned int) ((1.0 / YM2612->Frequence) * (double) (0x4000));
    YM2612->Inter_Cnt = 0;

    // We recalculate rate and frequence after interpolation

    YM2612->Rate = YM2612->Clock / 144;
    YM2612->Frequence = 1.0;
  }
  else
  {
    YM2612->Inter_Step = 0x4000;
    YM2612->Inter_Cnt = 0;
  }

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "YM2612 frequence = %g rate = %d  interp step = %.8X\n\n", YM2612->Frequence, YM2612->Rate, YM2612->Inter_Step);
#endif

  // Tableau TL :
  // [0     -  4095] = +output  [4095  - ...] = +output overflow (fill with 0)
  // [12288 - 16383] = -output  [16384 - ...] = -output overflow (fill with 0)

  for (i = 0; i < TL_LENGTH; i++)
  {
    if (i >= PG_CUT_OFF)  // YM2612 cut off sound after 78 dB (14 bits output ?)
    {
      TL_TAB[TL_LENGTH + i] = TL_TAB[i] = 0;
    }
    else
    {
      x = MAX_OUT;                // Max output
      x /= pow(10, (ENV_STEP * i) / 20);      // Decibel -> Voltage

      TL_TAB[i] = (int) x;
      TL_TAB[TL_LENGTH + i] = -TL_TAB[i];
    }

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "TL_TAB[%d] = %.8X    TL_TAB[%d] = %.8X\n", i, TL_TAB[i], TL_LENGTH + i, TL_TAB[TL_LENGTH + i]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau SIN :
  // SIN_TAB[x][y] = sin(x) * y;
  // x = phase and y = volume

  SIN_TAB[0] = SIN_TAB[SIN_LENGTH / 2] = &TL_TAB[(int) PG_CUT_OFF];

  for (i = 1; i <= SIN_LENGTH / 4; i++)
  {
    x = sin(2.0 * M_PI * (double) (i) / (double) (SIN_LENGTH));  // Sinus
    x = 20 * log10(1 / x);                    // convert to dB

    j = (int) (x / ENV_STEP);            // Get TL range

    if (j > PG_CUT_OFF)
      j = (int) PG_CUT_OFF;

    SIN_TAB[i] = SIN_TAB[(SIN_LENGTH / 2) - i] = &TL_TAB[j];
    SIN_TAB[(SIN_LENGTH / 2) + i] = SIN_TAB[SIN_LENGTH - i] = &TL_TAB[TL_LENGTH + j];

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X    SIN[%d][0] = %.8X\n", i, SIN_TAB[i][0], (SIN_LENGTH / 2) - i, SIN_TAB[(SIN_LENGTH / 2) - i][0], (SIN_LENGTH / 2) + i, SIN_TAB[(SIN_LENGTH / 2) + i][0], SIN_LENGTH - i, SIN_TAB[SIN_LENGTH - i][0]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau LFO (LFO wav) :

  for (i = 0; i < LFO_LENGTH; i++)
  {
    x = sin(2.0 * M_PI * (double) (i) / (double) (LFO_LENGTH));  // Sinus
    x += 1.0;
    x /= 2.0;          // positive only
    x *= 11.8 / ENV_STEP;    // ajusted to MAX enveloppe modulation

    LFO_ENV_TAB[i] = (int) x;

    x = sin(2.0 * M_PI * (double) (i) / (double) (LFO_LENGTH));  // Sinus
    x *= (double) ((1 << (LFO_HBITS - 1)) - 1);

    LFO_FREQ_TAB[i] = (int) x;

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "LFO[%d] = %.8X\n", i, LFO_ENV_TAB[i]);
#endif
  }

#if YM_DEBUG_LEVEL > 2
  fprintf(debug_file, "\n\n\n\n");
#endif

  // Tableau Enveloppe :
  // ENV_TAB[0] -> ENV_TAB[ENV_LENGTH - 1]        = attack curve
  // ENV_TAB[ENV_LENGTH] -> ENV_TAB[2 * ENV_LENGTH - 1]  = decay curve

  for (i = 0; i < ENV_LENGTH; i++)
  {
    // Attack curve (x^8 - music level 2 Vectorman 2)
    x = pow(((double) ((ENV_LENGTH - 1) - i) / (double) (ENV_LENGTH)), 8);
    x *= ENV_LENGTH;

    ENV_TAB[i] = (int) x;

    // Decay curve (just linear)
    x = pow(((double) (i) / (double) (ENV_LENGTH)), 1);
    x *= ENV_LENGTH;

    ENV_TAB[ENV_LENGTH + i] = (int) x;

#if YM_DEBUG_LEVEL > 2
    fprintf(debug_file, "ATTACK[%d] = %d   DECAY[%d] = %d\n", i, ENV_TAB[i], i, ENV_TAB[ENV_LENGTH + i]);
#endif
  }

  ENV_TAB[ENV_END >> ENV_LBITS] = ENV_LENGTH - 1;    // for the stopped state

  // Tableau pour la conversion Attack -> Decay and Decay -> Attack

  for (i = 0, j = ENV_LENGTH - 1; i < ENV_LENGTH; i++)
  {
    while (j && (ENV_TAB[j] < (unsigned) i))
      j--;

    DECAY_TO_ATTACK[i] = j << ENV_LBITS;
  }

  // Tableau pour le Substain Level

  for (i = 0; i < 15; i++)
  {
    x = i * 3;          // 3 and not 6 (Mickey Mania first music for test)
    x /= ENV_STEP;

    j = (int) x;
    j <<= ENV_LBITS;

    SL_TAB[i] = j + ENV_DECAY;
  }

  j = ENV_LENGTH - 1;        // special case : volume off
  j <<= ENV_LBITS;
  SL_TAB[15] = j + ENV_DECAY;

  // Tableau Frequency Step

  for (i = 0; i < 2048; i++)
  {
    x = (double) (i) * YM2612->Frequence;

    #if ((SIN_LBITS + SIN_HBITS - (21 - 7)) < 0)
      x /= (double) (1 << ((21 - 7) - SIN_LBITS - SIN_HBITS));
    #else
      x *= (double) (1 << (SIN_LBITS + SIN_HBITS - (21 - 7)));
    #endif

    x /= 2.0;  // because MUL = value * 2

    YM2612->FINC_TAB[i] = (unsigned int) x;
  }

  // Tableaux Attack & Decay Rate

  for (i = 0; i < 4; i++)
  {
    YM2612->AR_TAB[i] = 0;
    YM2612->DR_TAB[i] = 0;
  }

  for (i = 0; i < 60; i++)
  {
    x = YM2612->Frequence;

    x *= 1.0 + ((i & 3) * 0.25);                // bits 0-1 : x1.00, x1.25, x1.50, x1.75
    x *= (double) (1 << ((i >> 2)));            // bits 2-5 : shift bits (x2^0 - x2^15)
    x *= (double) (ENV_LENGTH << ENV_LBITS);    // on ajuste pour le tableau ENV_TAB

    YM2612->AR_TAB[i + 4] = (unsigned int) (x / AR_RATE);
    YM2612->DR_TAB[i + 4] = (unsigned int) (x / DR_RATE);
  }

  for (i = 64; i < 96; i++)
  {
    YM2612->AR_TAB[i] = YM2612->AR_TAB[63];
    YM2612->DR_TAB[i] = YM2612->DR_TAB[63];

    NULL_RATE[i - 64] = 0;
  }

  // Tableau Detune

  for (i = 0; i < 4; i++)
  {
    for (j = 0; j < 32; j++)
    {
      #if ((SIN_LBITS + SIN_HBITS - 21) < 0)
        x = (double)DT_DEF_TAB[i][j] * YM2612->Frequence /
            (double)(1 << (21 - SIN_LBITS - SIN_HBITS));
      #else
        x = (double)DT_DEF_TAB[i][j] * YM2612->Frequence *
            (double)(1 << (SIN_LBITS + SIN_HBITS - 21));
      #endif

      YM2612->DT_TAB[i + 0][j] = (int) x;
      YM2612->DT_TAB[i + 4][j] = (int) -x;
    }
  }

  // Tableau LFO

  j = (YM2612->Rate * YM2612->Inter_Step) / 0x4000;

  YM2612->LFO_INC_TAB[0] = (unsigned int) (3.98 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[1] = (unsigned int) (5.56 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[2] = (unsigned int) (6.02 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[3] = (unsigned int) (6.37 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[4] = (unsigned int) (6.88 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[5] = (unsigned int) (9.63 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[6] = (unsigned int) (48.1 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);
  YM2612->LFO_INC_TAB[7] = (unsigned int) (72.2 * (double) (1 << (LFO_HBITS + LFO_LBITS)) / j);

  YM2612_SetMute(YM2612, 0x00);
  //YM2612_Reset(YM2612);

  return YM2612;
}